

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkIvyAfter(Abc_Ntk_t *pNtk,Ivy_Man_t *pMan,int fSeq,int fHaig)

{
  Vec_Ptr_t *pVVar1;
  ulong uVar2;
  void *pvVar3;
  void **ppvVar4;
  long *plVar5;
  int iVar6;
  Abc_Ntk_t *pAVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  Abc_Obj_t *pObj;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar10;
  ulong uVar11;
  Vec_Ptr_t *pVVar12;
  Vec_Int_t *pVVar13;
  Abc_Ntk_t *pAVar14;
  ulong uVar15;
  void *pvVar16;
  size_t __size;
  uint uVar17;
  ulong uVar18;
  char *__ptr;
  uint uVar19;
  uint uVar20;
  long lVar21;
  Vec_Int_t *local_50;
  Abc_Ntk_t *local_48;
  Vec_Int_t *local_40;
  Abc_Ntk_t *local_38;
  
  if (fSeq == 0) {
    pAVar7 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    pAVar8 = Abc_AigConst1(pAVar7);
    pMan->pConst1->TravId =
         ((uint)pAVar8 & 1) + *(int *)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x10) * 2;
    pVVar12 = pNtk->vCis;
    uVar15 = (ulong)pVVar12->nSize;
    if (0 < (long)uVar15) {
      pVVar1 = pMan->vPis;
      uVar19 = pVVar1->nSize;
      uVar18 = 0;
      uVar11 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        uVar11 = uVar18;
      }
      do {
        if (uVar11 == uVar18) goto LAB_00271df6;
        uVar2 = *(ulong *)((long)pVVar12->pArray[uVar18] + 0x40);
        *(uint *)((long)pVVar1->pArray[uVar18] + 4) =
             ((uint)uVar2 & 1) + *(int *)((uVar2 & 0xfffffffffffffffe) + 0x10) * 2;
        uVar18 = uVar18 + 1;
      } while (uVar15 != uVar18);
    }
    pVVar13 = Ivy_ManDfs(pMan);
    if (0 < pVVar13->nSize) {
      lVar21 = 0;
      do {
        iVar6 = pVVar13->pArray[lVar21];
        if (((long)iVar6 < 0) || (pMan->vObjs->nSize <= iVar6)) goto LAB_00271df6;
        pvVar3 = pMan->vObjs->pArray[iVar6];
        if (pvVar3 == (void *)0x0) break;
        uVar19 = *(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 4);
        uVar17 = (int)uVar19 >> 1;
        if ((int)uVar17 < 0) goto LAB_00271df6;
        iVar6 = pAVar7->vObjs->nSize;
        if (iVar6 <= (int)uVar17) goto LAB_00271df6;
        ppvVar4 = pAVar7->vObjs->pArray;
        pvVar16 = ppvVar4[uVar17];
        pAVar8 = (Abc_Obj_t *)
                 ((ulong)(((uint)*(ulong *)((long)pvVar3 + 0x10) ^ uVar19) & 1) ^ (ulong)pvVar16);
        uVar19 = *(uint *)((long)pvVar3 + 8) & 0xf;
        if (uVar19 == 7) {
          iVar6 = ((uint)pAVar8 & 1) + *(int *)(((ulong)pvVar16 & 0xfffffffffffffffe) + 0x10) * 2;
        }
        else {
          uVar17 = *(uint *)((*(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffffe) + 4);
          uVar20 = (int)uVar17 >> 1;
          if (((int)uVar20 < 0) || (iVar6 <= (int)uVar20)) goto LAB_00271df6;
          pAVar9 = (Abc_Obj_t *)
                   ((ulong)(((uint)*(ulong *)((long)pvVar3 + 0x18) ^ uVar17) & 1) ^
                   (ulong)ppvVar4[uVar20]);
          if (uVar19 == 6) {
            pAVar8 = Abc_AigXor((Abc_Aig_t *)pAVar7->pManFunc,pAVar8,pAVar9);
          }
          else {
            pAVar8 = Abc_AigAnd((Abc_Aig_t *)pAVar7->pManFunc,pAVar8,pAVar9);
          }
          iVar6 = ((uint)pAVar8 & 1) + *(int *)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x10) * 2;
        }
        *(int *)((long)pvVar3 + 4) = iVar6;
        lVar21 = lVar21 + 1;
      } while (lVar21 < pVVar13->nSize);
    }
    pVVar12 = pNtk->vCos;
    if (0 < pVVar12->nSize) {
      lVar21 = 0;
      do {
        if (pMan->vPos->nSize <= lVar21) goto LAB_00271df6;
        uVar15 = *(ulong *)((long)pMan->vPos->pArray[lVar21] + 0x10);
        uVar19 = *(uint *)((uVar15 & 0xfffffffffffffffe) + 4);
        uVar17 = (int)uVar19 >> 1;
        if (((int)uVar17 < 0) || (pAVar7->vObjs->nSize <= (int)uVar17)) goto LAB_00271df6;
        Abc_ObjAddFanin(*(Abc_Obj_t **)((long)pVVar12->pArray[lVar21] + 0x40),
                        (Abc_Obj_t *)
                        ((ulong)(((uint)uVar15 ^ uVar19) & 1) ^ (ulong)pAVar7->vObjs->pArray[uVar17]
                        ));
        lVar21 = lVar21 + 1;
        pVVar12 = pNtk->vCos;
      } while (lVar21 < pVVar12->nSize);
    }
    if (pVVar13->pArray != (int *)0x0) {
      free(pVVar13->pArray);
      pVVar13->pArray = (int *)0x0;
    }
    if (pVVar13 != (Vec_Int_t *)0x0) {
      free(pVVar13);
    }
    iVar6 = Abc_NtkCheck(pAVar7);
    if (iVar6 != 0) goto LAB_00271d83;
    __ptr = "Abc_NtkFromIvy(): Network check has failed.\n";
    __size = 0x2c;
  }
  else {
    pAVar7 = Abc_NtkStartFromNoLatches(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    pAVar8 = Abc_AigConst1(pAVar7);
    pMan->pConst1->TravId =
         ((uint)pAVar8 & 1) + *(int *)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x10) * 2;
    pVVar12 = pNtk->vPis;
    uVar15 = (ulong)pVVar12->nSize;
    if (0 < (long)uVar15) {
      pVVar1 = pMan->vPis;
      uVar19 = pVVar1->nSize;
      uVar18 = 0;
      uVar11 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        uVar11 = uVar18;
      }
      do {
        if (uVar11 == uVar18) goto LAB_00271df6;
        uVar2 = *(ulong *)((long)pVVar12->pArray[uVar18] + 0x40);
        *(uint *)((long)pVVar1->pArray[uVar18] + 4) =
             ((uint)uVar2 & 1) + *(int *)((uVar2 & 0xfffffffffffffffe) + 0x10) * 2;
        uVar18 = uVar18 + 1;
      } while (uVar15 != uVar18);
    }
    local_48 = pAVar7;
    local_38 = pNtk;
    local_40 = Ivy_ManDfsSeq(pMan,&local_50);
    if (0 < local_50->nSize) {
      lVar21 = 0;
      do {
        pAVar7 = local_48;
        iVar6 = local_50->pArray[lVar21];
        if (((long)iVar6 < 0) || (pMan->vObjs->nSize <= iVar6)) goto LAB_00271df6;
        pvVar3 = pMan->vObjs->pArray[iVar6];
        if (pvVar3 == (void *)0x0) break;
        pAVar8 = Abc_NtkCreateObj(local_48,ABC_OBJ_LATCH);
        pAVar9 = Abc_NtkCreateObj(pAVar7,ABC_OBJ_BI);
        pObj = Abc_NtkCreateObj(pAVar7,ABC_OBJ_BO);
        Abc_ObjAddFanin(pAVar8,pAVar9);
        Abc_ObjAddFanin(pObj,pAVar8);
        if (fHaig == 0) {
          switch(*(uint *)((long)pvVar3 + 8) >> 9 & 3) {
          case 0:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcIvy.c"
                          ,0x33c,"Abc_Ntk_t *Abc_NtkFromIvySeq(Abc_Ntk_t *, Ivy_Man_t *, int)");
          case 1:
            aVar10 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
            if ((*(uint *)&pAVar8->field_0x14 & 0xf) != 8) {
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                            ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
            }
            break;
          case 2:
            aVar10 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x2;
            if ((*(uint *)&pAVar8->field_0x14 & 0xf) != 8) {
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                            ,0x1a5,"void Abc_LatchSetInit1(Abc_Obj_t *)");
            }
            break;
          case 3:
            goto switchD_00271783_caseD_3;
          }
        }
        else {
switchD_00271783_caseD_3:
          aVar10 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
          if ((*(uint *)&pAVar8->field_0x14 & 0xf) != 8) {
            __assert_fail("Abc_ObjIsLatch(pLatch)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                          ,0x1a6,"void Abc_LatchSetInitDc(Abc_Obj_t *)");
          }
        }
        pAVar8->field_5 = aVar10;
        *(uint *)((long)pvVar3 + 4) =
             ((uint)pObj & 1) + *(int *)(((ulong)pObj & 0xfffffffffffffffe) + 0x10) * 2;
        lVar21 = lVar21 + 1;
      } while (lVar21 < local_50->nSize);
    }
    pAVar7 = local_48;
    Abc_NtkAddDummyBoxNames(local_48);
    pNtk = local_38;
    pVVar13 = local_40;
    if (0 < local_40->nSize) {
      lVar21 = 0;
      do {
        iVar6 = pVVar13->pArray[lVar21];
        if (((long)iVar6 < 0) || (pMan->vObjs->nSize <= iVar6)) goto LAB_00271df6;
        pvVar3 = pMan->vObjs->pArray[iVar6];
        if (pvVar3 == (void *)0x0) break;
        uVar19 = *(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 4);
        uVar17 = (int)uVar19 >> 1;
        if ((int)uVar17 < 0) goto LAB_00271df6;
        iVar6 = pAVar7->vObjs->nSize;
        if (iVar6 <= (int)uVar17) goto LAB_00271df6;
        ppvVar4 = pAVar7->vObjs->pArray;
        pvVar16 = ppvVar4[uVar17];
        pAVar8 = (Abc_Obj_t *)
                 ((ulong)(((uint)*(ulong *)((long)pvVar3 + 0x10) ^ uVar19) & 1) ^ (ulong)pvVar16);
        uVar19 = *(uint *)((long)pvVar3 + 8) & 0xf;
        if (uVar19 == 7) {
          *(uint *)((long)pvVar3 + 4) =
               ((uint)pAVar8 & 1) + *(int *)(((ulong)pvVar16 & 0xfffffffffffffffe) + 0x10) * 2;
        }
        else {
          uVar17 = *(uint *)((*(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffffe) + 4);
          uVar20 = (int)uVar17 >> 1;
          if (((int)uVar20 < 0) || (iVar6 <= (int)uVar20)) goto LAB_00271df6;
          pAVar9 = (Abc_Obj_t *)
                   ((ulong)(((uint)*(ulong *)((long)pvVar3 + 0x18) ^ uVar17) & 1) ^
                   (ulong)ppvVar4[uVar20]);
          if (uVar19 == 6) {
            pAVar8 = Abc_AigXor((Abc_Aig_t *)pAVar7->pManFunc,pAVar8,pAVar9);
          }
          else {
            pAVar8 = Abc_AigAnd((Abc_Aig_t *)pAVar7->pManFunc,pAVar8,pAVar9);
          }
          iVar6 = *(int *)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x10);
          *(uint *)((long)pvVar3 + 4) = ((uint)pAVar8 & 1) + iVar6 * 2;
          if (((fHaig != 0) && (pvVar16 = *(void **)((long)pvVar3 + 0x48), pvVar16 != (void *)0x0))
             && (0 < *(int *)((long)pvVar3 + 0xc))) {
            uVar19 = iVar6 * 2 >> 1;
            if (((int)uVar19 < 0) || (pAVar7->vObjs->nSize <= (int)uVar19)) goto LAB_00271df6;
            if (((ulong)pvVar16 & 1) != 0) {
              __assert_fail("!Ivy_IsComplement(pNode->pEquiv)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcIvy.c"
                            ,0x357,"Abc_Ntk_t *Abc_NtkFromIvySeq(Abc_Ntk_t *, Ivy_Man_t *, int)");
            }
            uVar15 = (ulong)((uint)pAVar8 & 1) ^ (ulong)pAVar7->vObjs->pArray[uVar19];
            for (; pvVar16 != pvVar3;
                pvVar16 = (void *)(*(ulong *)((long)pvVar16 + 0x48) & 0xfffffffffffffffe)) {
              uVar19 = (int)*(uint *)((long)pvVar16 + 4) >> 1;
              if (((int)uVar19 < 0) || (pAVar7->vObjs->nSize <= (int)uVar19)) goto LAB_00271df6;
              uVar11 = (ulong)(*(uint *)((long)pvVar16 + 4) & 1) ^
                       (ulong)pAVar7->vObjs->pArray[uVar19];
              *(ulong *)(uVar15 + 0x38) = uVar11;
              uVar15 = uVar11;
            }
            *(undefined8 *)(uVar15 + 0x38) = 0;
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 < pVVar13->nSize);
    }
    pVVar12 = pNtk->vPos;
    if (0 < pVVar12->nSize) {
      lVar21 = 0;
      do {
        if (pMan->vPos->nSize <= lVar21) goto LAB_00271df6;
        uVar15 = *(ulong *)((long)pMan->vPos->pArray[lVar21] + 0x10);
        uVar19 = *(uint *)((uVar15 & 0xfffffffffffffffe) + 4);
        uVar17 = (int)uVar19 >> 1;
        if (((int)uVar17 < 0) || (pAVar7->vObjs->nSize <= (int)uVar17)) goto LAB_00271df6;
        Abc_ObjAddFanin(*(Abc_Obj_t **)((long)pVVar12->pArray[lVar21] + 0x40),
                        (Abc_Obj_t *)
                        ((ulong)(((uint)uVar15 ^ uVar19) & 1) ^ (ulong)pAVar7->vObjs->pArray[uVar17]
                        ));
        lVar21 = lVar21 + 1;
        pVVar12 = pNtk->vPos;
      } while (lVar21 < pVVar12->nSize);
    }
    if (0 < local_50->nSize) {
      lVar21 = 0;
LAB_00271a0e:
      iVar6 = local_50->pArray[lVar21];
      if (((long)iVar6 < 0) || (pMan->vObjs->nSize <= iVar6)) {
LAB_00271df6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pMan->vObjs->pArray[iVar6];
      if (pvVar3 != (void *)0x0) {
        uVar15 = *(ulong *)((long)pvVar3 + 0x10);
        uVar19 = *(uint *)((uVar15 & 0xfffffffffffffffe) + 4);
        uVar17 = (int)uVar19 >> 1;
        if ((((int)uVar17 < 0) || (pAVar7->vObjs->nSize <= (int)uVar17)) ||
           (pAVar7->vBoxes->nSize <= lVar21)) goto LAB_00271df6;
        plVar5 = (long *)pAVar7->vBoxes->pArray[lVar21];
        Abc_ObjAddFanin(*(Abc_Obj_t **)
                         (*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[4] * 8),
                        (Abc_Obj_t *)
                        ((ulong)(((uint)uVar15 ^ uVar19) & 1) ^ (ulong)pAVar7->vObjs->pArray[uVar17]
                        ));
        lVar21 = lVar21 + 1;
        if (lVar21 < local_50->nSize) goto LAB_00271a0e;
      }
    }
    if (local_50->pArray != (int *)0x0) {
      free(local_50->pArray);
      local_50->pArray = (int *)0x0;
    }
    if (local_50 != (Vec_Int_t *)0x0) {
      free(local_50);
    }
    if (pVVar13->pArray != (int *)0x0) {
      free(pVVar13->pArray);
      pVVar13->pArray = (int *)0x0;
    }
    if (pVVar13 != (Vec_Int_t *)0x0) {
      free(pVVar13);
    }
    iVar6 = Abc_NtkCheck(pAVar7);
    if (iVar6 != 0) goto LAB_00271d83;
    __ptr = "Abc_NtkFromIvySeq(): Network check has failed.\n";
    __size = 0x2f;
  }
  fwrite(__ptr,__size,1,_stdout);
LAB_00271d83:
  if ((fHaig == 0) && (uVar19 = Abc_AigCleanup((Abc_Aig_t *)pAVar7->pManFunc), uVar19 != 0)) {
    printf("Warning: AIG cleanup removed %d nodes (this is not a bug).\n",(ulong)uVar19);
  }
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    pAVar14 = Abc_NtkDup(pNtk->pExdc);
    pAVar7->pExdc = pAVar14;
  }
  iVar6 = Abc_NtkCheck(pAVar7);
  if (iVar6 == 0) {
    puts("Abc_NtkStrash: The network check has failed.");
    Abc_NtkDelete(pAVar7);
    pAVar7 = (Abc_Ntk_t *)0x0;
  }
  return pAVar7;
}

Assistant:

Abc_Ntk_t * Abc_NtkIvyAfter( Abc_Ntk_t * pNtk, Ivy_Man_t * pMan, int fSeq, int fHaig )
{
    Abc_Ntk_t * pNtkAig;
    int nNodes, fCleanup = 1;
    // convert from the AIG manager
    if ( fSeq )
        pNtkAig = Abc_NtkFromIvySeq( pNtk, pMan, fHaig );
    else
        pNtkAig = Abc_NtkFromIvy( pNtk, pMan );
    // report the cleanup results
    if ( !fHaig && fCleanup && (nNodes = Abc_AigCleanup((Abc_Aig_t *)pNtkAig->pManFunc)) )
        printf( "Warning: AIG cleanup removed %d nodes (this is not a bug).\n", nNodes );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;
}